

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_client.hpp
# Opt level: O0

void __thiscall
rest_rpc::rpc_client::subscribe<test_sub1()::__1>
          (void *param_1,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *param_3)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
  key;
  undefined1 uVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_false,_true>,_bool>
  pVar3;
  iterator it;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> composite_key;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
  *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff81;
  undefined7 in_stack_ffffffffffffff91;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
  local_60 [3];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
  local_48;
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  void *local_10;
  
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  std::operator+(param_3,param_2);
  local_48._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
       ::find(in_stack_ffffffffffffff28,(key_type *)0x1b047e);
  local_60[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
       ::end(in_stack_ffffffffffffff28);
  bVar1 = std::__detail::operator!=(&local_48,local_60);
  if (!bVar1) {
    pVar3 = std::
            unordered_map<std::__cxx11::string,std::function<void(nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>)>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::function<void(nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>)>>>>
            ::emplace<std::__cxx11::string,test_sub1()::__1>
                      ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff38,
                       (anon_class_1_0_00000001 *)
                       CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    key._M_cur = (__node_type *)
                 pVar3.first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>)>_>,_true>
                 ._M_cur;
    uVar2 = pVar3.second;
    send_subscribe((rpc_client *)CONCAT71(in_stack_ffffffffffffff91,uVar2),(string *)key._M_cur,
                   (string *)CONCAT71(in_stack_ffffffffffffff81,in_stack_ffffffffffffff80));
    std::
    set<std::pair<std::__cxx11::string,std::__cxx11::string>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::emplace<std::__cxx11::string,std::__cxx11::string>
              ((set<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)param_2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)key._M_cur,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(uVar2,in_stack_ffffffffffffff40));
  }
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void subscribe(std::string key, std::string token, Func f) {
    auto composite_key = key + token;
    auto it = sub_map_.find(composite_key);
    if (it != sub_map_.end()) {
      assert("duplicated subscribe");
      return;
    }

    sub_map_.emplace(std::move(composite_key), std::move(f));
    send_subscribe(key, token);
    key_token_set_.emplace(std::move(key), std::move(token));
  }